

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O0

int mriStep_NlsFPFunction(N_Vector zcor,N_Vector g,void *arkode_mem)

{
  int iVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = mriStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (ARKodeMRIStepMem *)0x1830ce);
  if (local_4 == 0) {
    N_VLinearSum(0x3ff0000000000000,*(undefined8 *)(in_stack_ffffffffffffffd0 + 0x90),in_RDI,
                 *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x248));
    iVar1 = (**(code **)(in_stack_ffffffffffffffd0 + 0xb8))
                      (*(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x2f0),
                       *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x248),
                       *(undefined8 *)
                        (*(long *)(in_stack_ffffffffffffffd0 + 0x30) +
                        (long)*(int *)(*(long *)(in_stack_ffffffffffffffd0 + 0x68) +
                                      (long)*(int *)(in_stack_ffffffffffffffd0 + 0xa0) * 4) * 8),
                       *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x10));
    *(long *)(in_stack_ffffffffffffffd0 + 0x1a0) = *(long *)(in_stack_ffffffffffffffd0 + 0x1a0) + 1;
    if (iVar1 < 0) {
      local_4 = -8;
    }
    else if (iVar1 < 1) {
      N_VLinearSum(*(undefined8 *)(in_stack_ffffffffffffffd0 + 0xc0),0x3ff0000000000000,
                   *(undefined8 *)
                    (*(long *)(in_stack_ffffffffffffffd0 + 0x30) +
                    (long)*(int *)(*(long *)(in_stack_ffffffffffffffd0 + 0x68) +
                                  (long)*(int *)(in_stack_ffffffffffffffd0 + 0xa0) * 4) * 8),
                   *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x88),in_RSI);
      local_4 = 0;
    }
    else {
      local_4 = 9;
    }
  }
  return local_4;
}

Assistant:

int mriStep_NlsFPFunction(N_Vector zcor, N_Vector g, void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute slow implicit RHS and save for later */
  retval = step_mem->nls_fsi(ark_mem->tcur, ark_mem->ycur,
                             step_mem->Fsi[step_mem->stage_map[step_mem->istage]],
                             ark_mem->user_data);
  step_mem->nfsi++;
  if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
  if (retval > 0) { return (RHSFUNC_RECVR); }

  /* combine parts:  g = gamma*Fsi(z) + sdata */
  N_VLinearSum(step_mem->gamma,
               step_mem->Fsi[step_mem->stage_map[step_mem->istage]], ONE,
               step_mem->sdata, g);

  return (ARK_SUCCESS);
}